

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

optional<unsigned_int> convert_gram(IndexType type,uint64_t source)

{
  bool bVar1;
  size_t sVar2;
  TrigramGenerator p_Var3;
  uchar *puVar4;
  anon_class_8_1_6971b95b *__f;
  ulong in_RSI;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mem;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int size;
  uint *in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  function<void_(unsigned_int)> *this;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  function<void_(unsigned_int)> local_88;
  undefined1 local_61;
  int local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  ulong local_18;
  _Optional_payload_base<unsigned_int> local_8;
  
  local_18 = in_RSI;
  sVar2 = get_ngram_size_for((IndexType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  local_1c = (int)sVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x20fc76);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x20fc85);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
            );
  for (local_60 = 0; local_60 < local_1c; local_60 = local_60 + 1) {
    local_61 = (undefined1)(local_18 >> (((char)local_1c - (char)local_60) * '\b' - 8U & 0x3f));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  }
  p_Var3 = get_generator_for((IndexType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x20fd20);
  __f = (anon_class_8_1_6971b95b *)(long)local_1c;
  this = &local_88;
  std::function<void(unsigned_int)>::function<convert_gram(IndexType,unsigned_long)::__0,void>
            (this,__f);
  (*p_Var3)(puVar4,(uint64_t)__f,this);
  std::function<void_(unsigned_int)>::~function((function<void_(unsigned_int)> *)0x20fd75);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  if (bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_38,0);
    local_8 = (_Optional_payload_base<unsigned_int>)
              std::make_optional<unsigned_int&>(in_stack_ffffffffffffff38);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, uint64_t source) {
    int size = get_ngram_size_for(type);
    std::vector<TriGram> result;
    std::vector<uint8_t> mem;
    mem.reserve(size);
    for (int i = 0; i < size; i++) {
        mem.push_back(((source) >> ((size - i - 1) * 8)) & 0xFF);
    }
    get_generator_for(type)(
        mem.data(), size, [&result](uint32_t gram) { result.push_back(gram); });
    if (result.empty()) {
        return std::nullopt;
    }
    return std::make_optional(result[0]);
}